

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::cluster_config::serialize(cluster_config *this)

{
  size_t sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar2;
  ulong *in_RSI;
  size_t i;
  ulong *puVar3;
  ulong uVar4;
  ptr<buffer> pVar5;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  srv_buffs;
  ptr<buffer> buf;
  
  srv_buffs.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srv_buffs.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  srv_buffs.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0x15;
  puVar3 = in_RSI + 7;
  while (puVar3 = (ulong *)*puVar3, puVar3 != in_RSI + 7) {
    srv_config::serialize((srv_config *)&buf);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::push_back(&srv_buffs,(value_type *)&buf);
    sVar1 = buffer::size(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    lVar2 = lVar2 + sVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  buffer::alloc((buffer *)this,in_RSI[4] + lVar2 + 4);
  buffer::put((buffer *)this->log_idx_,*in_RSI);
  buffer::put((buffer *)this->log_idx_,in_RSI[1]);
  buffer::put((buffer *)this->log_idx_,(byte)in_RSI[2]);
  buffer::put((buffer *)this->log_idx_,(byte *)in_RSI[3],in_RSI[4]);
  buffer::put((buffer *)this->log_idx_,(int32)in_RSI[9]);
  lVar2 = 0;
  uVar4 = 0;
  while( true ) {
    if ((ulong)((long)srv_buffs.
                      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)srv_buffs.
                      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
    buffer::put((buffer *)this->log_idx_,
                *(buffer **)
                 ((long)&((srv_buffs.
                           super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar2));
    uVar4 = uVar4 + 1;
    lVar2 = lVar2 + 0x10;
  }
  buffer::pos((buffer *)this->log_idx_,0);
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector(&srv_buffs);
  pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> cluster_config::serialize() const {
    size_t sz = 2 * sz_ulong + sz_int + sz_byte;
    std::vector<ptr<buffer>> srv_buffs;
    for (auto it = servers_.cbegin(); it != servers_.cend(); ++it) {
        ptr<buffer> buf = (*it)->serialize();
        srv_buffs.push_back(buf);
        sz += buf->size();
    }
    // For aux string.
    sz += sz_int;
    sz += user_ctx_.size();

    ptr<buffer> result = buffer::alloc(sz);
    result->put(log_idx_);
    result->put(prev_log_idx_);
    result->put((byte)(async_replication_ ? 1 : 0));
    result->put((byte*)user_ctx_.data(), user_ctx_.size());
    result->put((int32)servers_.size());
    for (size_t i = 0; i < srv_buffs.size(); ++i) {
        result->put(*srv_buffs[i]);
    }

    result->pos(0);
    return result;
}